

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::concat<kj::ArrayPtr<char_const>,kj::StringPtr&,kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,StringPtr *params_1,
          ArrayPtr<const_char> *params_2)

{
  size_t sVar1;
  char *__src;
  size_t sVar2;
  char *__dest;
  
  heapString(__return_storage_ptr__,
             ((params_1->content).size_ + params->size_ + *(long *)(this + 8)) - 1);
  __dest = (char *)(__return_storage_ptr__->content).size_;
  if (__dest != (char *)0x0) {
    __dest = (__return_storage_ptr__->content).ptr;
  }
  sVar1 = *(size_t *)(this + 8);
  if (sVar1 != 0) {
    memcpy(__dest,*(void **)this,sVar1);
    __dest = __dest + sVar1;
  }
  __src = params->ptr;
  sVar2 = params->size_;
  if (__src != __src + (sVar2 - 1)) {
    memcpy(__dest,__src,sVar2 - 1);
    __dest = __dest + (sVar2 - 1);
  }
  sVar1 = (params_1->content).size_;
  if (sVar1 != 0) {
    memcpy(__dest,(params_1->content).ptr,sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}